

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t is_LargeInode(char *file)

{
  int iVar1;
  char *in_RDI;
  int64_t ino;
  stat st;
  stat local_a0;
  wchar_t local_4;
  
  iVar1 = stat(in_RDI,&local_a0);
  if (iVar1 < 0) {
    local_4 = L'\0';
  }
  else {
    local_4 = (wchar_t)(0xffffffff < (long)local_a0.st_ino);
  }
  return local_4;
}

Assistant:

int
is_LargeInode(const char *file)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi;
	int r;

	r = my_GetFileInformationByName(file, &bhfi);
	if (r != 0)
		return (0);
	return (bhfi.nFileIndexHigh & 0x0000FFFFUL);
#else
	struct stat st;
	int64_t ino;

	if (stat(file, &st) < 0)
		return (0);
	ino = (int64_t)st.st_ino;
	return (ino > 0xffffffff);
#endif
}